

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

int ieee_ex_to_mips_mipsel(int xcpt)

{
  undefined4 local_10;
  int ret;
  int xcpt_local;
  
  local_10 = 0;
  if (xcpt != 0) {
    if ((xcpt & 1U) != 0) {
      local_10 = 0x10;
    }
    if ((xcpt & 8U) != 0) {
      local_10 = local_10 | 4;
    }
    if ((xcpt & 0x10U) != 0) {
      local_10 = local_10 | 2;
    }
    if ((xcpt & 4U) != 0) {
      local_10 = local_10 | 8;
    }
    if ((xcpt & 0x20U) != 0) {
      local_10 = local_10 | 1;
    }
  }
  return local_10;
}

Assistant:

int ieee_ex_to_mips(int xcpt)
{
    int ret = 0;
    if (xcpt) {
        if (xcpt & float_flag_invalid) {
            ret |= FP_INVALID;
        }
        if (xcpt & float_flag_overflow) {
            ret |= FP_OVERFLOW;
        }
        if (xcpt & float_flag_underflow) {
            ret |= FP_UNDERFLOW;
        }
        if (xcpt & float_flag_divbyzero) {
            ret |= FP_DIV0;
        }
        if (xcpt & float_flag_inexact) {
            ret |= FP_INEXACT;
        }
    }
    return ret;
}